

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_table_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  parasail_result_t *ppVar2;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  int *ptr_09;
  int *ptr_10;
  int *ptr_11;
  int *ptr_12;
  int *ptr_13;
  int a;
  undefined4 uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t size;
  size_t size_00;
  ulong uVar13;
  undefined4 uVar14;
  int iVar15;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_stats_table_scan_cold_8();
  }
  else if (s2Len < 1) {
    parasail_nw_stats_table_scan_cold_7();
  }
  else if (open < 0) {
    parasail_nw_stats_table_scan_cold_6();
  }
  else if (gap < 0) {
    parasail_nw_stats_table_scan_cold_5();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_stats_table_scan_cold_4();
  }
  else {
    uVar4 = (ulong)(uint)_s1Len;
    if (matrix->type == 1) {
      if (_s1 == (char *)0x0) {
        parasail_nw_stats_table_scan_cold_3();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      if (_s1 == (char *)0x0) {
        parasail_nw_stats_table_scan_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_nw_stats_table_scan_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    if (matrix->type != 0) {
      uVar4 = (ulong)(uint)matrix->length;
    }
    a = (int)uVar4;
    ppVar2 = parasail_result_new_table3(a,s2Len);
    if (ppVar2 != (parasail_result_t *)0x0) {
      ppVar2->flag = ppVar2->flag | 0x1430201;
      size = (size_t)a;
      ptr = parasail_memalign_int(0x10,size);
      ptr_00 = parasail_memalign_int(0x10,(ulong)(uint)s2Len);
      size_00 = (size_t)(a + 1);
      ptr_01 = parasail_memalign_int(0x10,size_00);
      ptr_02 = parasail_memalign_int(0x10,size_00);
      ptr_03 = parasail_memalign_int(0x10,size_00);
      ptr_04 = parasail_memalign_int(0x10,size_00);
      ptr_05 = parasail_memalign_int(0x10,size);
      ptr_06 = parasail_memalign_int(0x10,size);
      ptr_07 = parasail_memalign_int(0x10,size);
      ptr_08 = parasail_memalign_int(0x10,size);
      ptr_09 = parasail_memalign_int(0x10,size_00);
      ptr_10 = parasail_memalign_int(0x10,size_00);
      ptr_11 = parasail_memalign_int(0x10,size_00);
      ptr_12 = parasail_memalign_int(0x10,size_00);
      ptr_13 = parasail_memalign_int(0x10,size);
      if (ptr == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_00 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_01 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_02 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_03 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_04 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_05 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_06 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_07 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_08 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_09 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_10 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_11 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_12 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_13 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (0 < a) {
        piVar1 = matrix->mapper;
        uVar11 = 0;
        do {
          ptr[uVar11] = piVar1[(byte)_s1[uVar11]];
          uVar11 = uVar11 + 1;
        } while (uVar4 != uVar11);
      }
      piVar1 = matrix->mapper;
      uVar11 = 1;
      if (1 < s2Len) {
        uVar11 = (ulong)(uint)s2Len;
      }
      uVar13 = 0;
      do {
        ptr_00[uVar13] = piVar1[(byte)_s2[uVar13]];
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
      *ptr_01 = 0;
      *ptr_02 = 0;
      *ptr_03 = 0;
      *ptr_04 = 0;
      *ptr_09 = 0;
      if (0 < a) {
        iVar6 = -open;
        uVar11 = 0;
        do {
          ptr_01[uVar11 + 1] = iVar6;
          ptr_02[uVar11 + 1] = 0;
          ptr_03[uVar11 + 1] = 0;
          ptr_04[uVar11 + 1] = 0;
          uVar11 = uVar11 + 1;
          iVar6 = iVar6 - gap;
        } while (uVar4 != uVar11);
      }
      if (0 < a) {
        uVar11 = 0;
        do {
          ptr_05[uVar11] = -0x40000000;
          ptr_06[uVar11] = 0;
          ptr_07[uVar11] = 0;
          ptr_08[uVar11] = 0;
          uVar11 = uVar11 + 1;
        } while (uVar4 != uVar11);
      }
      uVar11 = 1;
      if (1 < s2Len) {
        uVar11 = (ulong)(uint)s2Len;
      }
      uVar13 = 0;
      do {
        if (0 < a) {
          lVar5 = 0;
          do {
            iVar6 = *(int *)((long)ptr_01 + lVar5 + 4) - open;
            iVar7 = *(int *)((long)ptr_05 + lVar5) - gap;
            if (iVar7 < iVar6) {
              *(int *)((long)ptr_05 + lVar5) = iVar6;
              *(undefined4 *)((long)ptr_06 + lVar5) = *(undefined4 *)((long)ptr_02 + lVar5 + 4);
              *(undefined4 *)((long)ptr_07 + lVar5) = *(undefined4 *)((long)ptr_03 + lVar5 + 4);
              *(undefined4 *)((long)ptr_08 + lVar5) = *(undefined4 *)((long)ptr_04 + lVar5 + 4);
            }
            else {
              *(int *)((long)ptr_05 + lVar5) = iVar7;
            }
            *(int *)((long)ptr_08 + lVar5) = *(int *)((long)ptr_08 + lVar5) + 1;
            lVar5 = lVar5 + 4;
          } while (uVar4 * 4 - lVar5 != 0);
        }
        iVar6 = -((int)uVar13 * gap + open);
        *ptr_09 = iVar6;
        if (0 < a) {
          piVar1 = matrix->matrix;
          uVar12 = 0;
          do {
            if (matrix->type == 0) {
              iVar7 = ptr[uVar12] * matrix->size;
            }
            else {
              iVar7 = matrix->size * (int)uVar12;
            }
            iVar7 = piVar1[(long)iVar7 + (long)ptr_00[uVar13]];
            iVar15 = ptr_01[uVar12] + iVar7;
            ptr_13[uVar12] = (uint)(iVar15 < ptr_05[uVar12]);
            if (iVar15 < ptr_05[uVar12]) {
              ptr_09[uVar12 + 1] = ptr_05[uVar12];
              ptr_10[uVar12 + 1] = ptr_06[uVar12];
              ptr_11[uVar12 + 1] = ptr_07[uVar12];
              iVar7 = ptr_08[uVar12];
            }
            else {
              ptr_09[uVar12 + 1] = iVar15;
              ptr_10[uVar12 + 1] = (uint)(ptr[uVar12] == ptr_00[uVar13]) + ptr_02[uVar12];
              ptr_11[uVar12 + 1] = (uint)(0 < iVar7) + ptr_03[uVar12];
              iVar7 = ptr_04[uVar12] + 1;
            }
            ptr_12[uVar12 + 1] = iVar7;
            uVar12 = uVar12 + 1;
          } while (uVar4 != uVar12);
        }
        if (0 < a) {
          iVar15 = -0x40000000;
          lVar5 = 0;
          iVar7 = 0;
          uVar14 = 0;
          uVar3 = 0;
          uVar12 = uVar13;
          do {
            iVar8 = iVar15 - gap;
            iVar15 = *(int *)((long)ptr_09 + lVar5);
            if (*(int *)((long)ptr_09 + lVar5) <= iVar8) {
              iVar15 = iVar8;
            }
            if (iVar8 < *(int *)((long)ptr_01 + lVar5)) {
              uVar3 = *(undefined4 *)((long)ptr_02 + lVar5);
              uVar14 = *(undefined4 *)((long)ptr_03 + lVar5);
              iVar7 = *(int *)((long)ptr_04 + lVar5);
            }
            iVar9 = iVar15 - open;
            iVar7 = iVar7 + 1;
            iVar8 = *(int *)((long)ptr_09 + lVar5 + 4);
            if (iVar9 < iVar8) {
              *(int *)((long)ptr_01 + lVar5 + 4) = iVar8;
              uVar10 = *(undefined4 *)((long)ptr_10 + lVar5 + 4);
LAB_00556a68:
              *(undefined4 *)((long)ptr_02 + lVar5 + 4) = uVar10;
              *(undefined4 *)((long)ptr_03 + lVar5 + 4) = *(undefined4 *)((long)ptr_11 + lVar5 + 4);
              iVar8 = *(int *)((long)ptr_12 + lVar5 + 4);
            }
            else {
              *(int *)((long)ptr_01 + lVar5 + 4) = iVar9;
              if ((*(int *)((long)ptr_09 + lVar5 + 4) == iVar9) &&
                 (*(int *)((long)ptr_13 + lVar5) == 0)) {
                uVar10 = *(undefined4 *)((long)ptr_10 + lVar5 + 4);
                goto LAB_00556a68;
              }
              *(undefined4 *)((long)ptr_02 + lVar5 + 4) = uVar3;
              *(undefined4 *)((long)ptr_03 + lVar5 + 4) = uVar14;
              iVar8 = iVar7;
            }
            *(int *)((long)ptr_04 + lVar5 + 4) = iVar8;
            *(undefined4 *)(*((ppVar2->field_4).trace)->trace_del_table + uVar12 * 4) =
                 *(undefined4 *)((long)ptr_01 + lVar5 + 4);
            *(undefined4 *)
             (*(long *)((long)((ppVar2->field_4).trace)->trace_del_table + 8) + uVar12 * 4) =
                 *(undefined4 *)((long)ptr_02 + lVar5 + 4);
            *(undefined4 *)
             (*(long *)((long)((ppVar2->field_4).trace)->trace_del_table + 0x10) + uVar12 * 4) =
                 *(undefined4 *)((long)ptr_03 + lVar5 + 4);
            *(undefined4 *)
             (*(long *)((long)((ppVar2->field_4).trace)->trace_del_table + 0x18) + uVar12 * 4) =
                 *(undefined4 *)((long)ptr_04 + lVar5 + 4);
            lVar5 = lVar5 + 4;
            uVar12 = uVar12 + (uint)s2Len;
          } while (uVar4 * 4 - lVar5 != 0);
        }
        *ptr_01 = iVar6;
        uVar13 = uVar13 + 1;
        if (uVar13 == uVar11) {
          ppVar2->score = ptr_01[size];
          ppVar2->end_query = a + -1;
          ppVar2->end_ref = s2Len + -1;
          ((ppVar2->field_4).stats)->matches = ptr_02[size];
          ((ppVar2->field_4).stats)->similar = ptr_03[size];
          ((ppVar2->field_4).stats)->length = ptr_04[size];
          parasail_free(ptr_13);
          parasail_free(ptr_12);
          parasail_free(ptr_11);
          parasail_free(ptr_10);
          parasail_free(ptr_09);
          parasail_free(ptr_08);
          parasail_free(ptr_07);
          parasail_free(ptr_06);
          parasail_free(ptr_05);
          parasail_free(ptr_04);
          parasail_free(ptr_03);
          parasail_free(ptr_02);
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          return ppVar2;
        }
      } while( true );
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H = NULL;
    int * restrict HMB = NULL;
    int * restrict HM = NULL;
    int * restrict HSB = NULL;
    int * restrict HS = NULL;
    int * restrict HLB = NULL;
    int * restrict HL = NULL;
    int * restrict E = NULL;
    int * restrict EM = NULL;
    int * restrict ES = NULL;
    int * restrict EL = NULL;
    int * restrict HtB = NULL;
    int * restrict Ht = NULL;
    int * restrict HtMB = NULL;
    int * restrict HtM = NULL;
    int * restrict HtSB = NULL;
    int * restrict HtS = NULL;
    int * restrict HtLB = NULL;
    int * restrict HtL = NULL;
    int * restrict Ex = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    HMB = parasail_memalign_int(16, s1Len+1);
    HM  = HMB+1;
    HSB = parasail_memalign_int(16, s1Len+1);
    HS  = HSB+1;
    HLB = parasail_memalign_int(16, s1Len+1);
    HL  = HLB+1;
    E  = parasail_memalign_int(16, s1Len);
    EM = parasail_memalign_int(16, s1Len);
    ES = parasail_memalign_int(16, s1Len);
    EL = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;
    HtMB= parasail_memalign_int(16, s1Len+1);
    HtM = HtMB+1;
    HtSB= parasail_memalign_int(16, s1Len+1);
    HtS = HtSB+1;
    HtLB= parasail_memalign_int(16, s1Len+1);
    HtL = HtLB+1;
    Ex = parasail_memalign_int(16, s1Len);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!HMB) return NULL;
    if (!HSB) return NULL;
    if (!HLB) return NULL;
    if (!E) return NULL;
    if (!EM) return NULL;
    if (!ES) return NULL;
    if (!EL) return NULL;
    if (!HtB) return NULL;
    if (!HtMB) return NULL;
    if (!HtSB) return NULL;
    if (!HtLB) return NULL;
    if (!Ex) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H,HM,HS,HL */
    H[-1] = 0;
    HM[-1] = 0;
    HS[-1] = 0;
    HL[-1] = 0;
    Ht[-1] = 0;
    for (i=0; i<s1Len; ++i) {
        H[i] = -open - i*gap;
        HM[i] = 0;
        HS[i] = 0;
        HL[i] = 0;
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
        EM[i] = 0;
        ES[i] = 0;
        EL[i] = 0;
    }

    /* iterate over database */
    for (j=0; j<s2Len; ++j) {
        int Ft = NEG_INF_32;
        int FtM = 0;
        int FtS = 0;
        int FtL = 0;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            int E_opn = H[i]-open;
            int E_ext = E[i]-gap;
            if (E_opn > E_ext) {
                E[i] = E_opn;
                EM[i] = HM[i];
                ES[i] = HS[i];
                EL[i] = HL[i];
            }
            else {
                E[i] = E_ext;
            }
            EL[i] += 1;
        }
        /* calculate Ht */
        Ht[-1] = -open -j*gap;
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            int H_dag = H[i-1]+matval;
            Ex[i] = (E[i] > H_dag);
            if (H_dag >= E[i]) {
                Ht[i] = H_dag;
                HtM[i] = HM[i-1] + (s1[i]==s2[j]);
                HtS[i] = HS[i-1] + (matval > 0);
                HtL[i] = HL[i-1] + 1;
            }
            else {
                Ht[i] = E[i];
                HtM[i] = EM[i];
                HtS[i] = ES[i];
                HtL[i] = EL[i];
            }
        }
        /* calculate H,HM,HS,HL */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            if (H[i-1] > Ft_ext) {
                FtM = HM[i-1];
                FtS = HS[i-1];
                FtL = HL[i-1] + 1;
            }
            else {
                FtL = FtL + 1;
            }
            if (Ht[i] > Ft_opn) {
                H[i] = Ht[i];
                HM[i] = HtM[i];
                HS[i] = HtS[i];
                HL[i] = HtL[i];
            }
            else {
                H[i] = Ft_opn;
                if (Ht[i] == Ft_opn) {
                    if (Ex[i]) {
                        /* we favor F/up/del when F and E scores tie */
                        HM[i] = FtM;
                        HS[i] = FtS;
                        HL[i] = FtL;
                    }
                    else {
                        HM[i] = HtM[i];
                        HS[i] = HtS[i];
                        HL[i] = HtL[i];
                    }
                }
                else {
                    HM[i] = FtM;
                    HS[i] = FtS;
                    HL[i] = FtL;
                }
            }
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*i*s2Len + j] = H[i];
            result->stats->tables->matches_table[1LL*i*s2Len + j] = HM[i];
            result->stats->tables->similar_table[1LL*i*s2Len + j] = HS[i];
            result->stats->tables->length_table[1LL*i*s2Len + j] = HL[i];
#endif
        }
        H[-1] = -open - j*gap;
#ifdef PARASAIL_ROWCOL
        if (j == s2Len-1) {
            for (i=0; i<s1Len; ++i) {
                result->stats->rowcols->score_col[i] = H[i];
                result->stats->rowcols->matches_col[i] = HM[i];
                result->stats->rowcols->similar_col[i] = HS[i];
                result->stats->rowcols->length_col[i] = HL[i];
            }
        }
        result->stats->rowcols->score_row[j] = H[s1Len-1];
        result->stats->rowcols->matches_row[j] = HM[s1Len-1];
        result->stats->rowcols->similar_row[j] = HS[s1Len-1];
        result->stats->rowcols->length_row[j] = HL[s1Len-1];
#endif
    }

    result->score = H[s1Len-1];
    result->end_query = s1Len-1;
    result->end_ref = s2Len-1;
    result->stats->matches = HM[s1Len-1];
    result->stats->similar = HS[s1Len-1];
    result->stats->length = HL[s1Len-1];

    parasail_free(Ex);
    parasail_free(HtLB);
    parasail_free(HtSB);
    parasail_free(HtMB);
    parasail_free(HtB);
    parasail_free(EL);
    parasail_free(ES);
    parasail_free(EM);
    parasail_free(E);
    parasail_free(HLB);
    parasail_free(HSB);
    parasail_free(HMB);
    parasail_free(HB);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}